

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O0

void __thiscall spdlog::populators::pattern_populator::~pattern_populator(pattern_populator *this)

{
  populator *in_RDI;
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *unaff_retaddr;
  
  in_RDI->_vptr_populator = (_func_int **)&PTR__pattern_populator_00214b80;
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  populator::~populator(in_RDI);
  return;
}

Assistant:

class SPDLOG_API pattern_populator : public populator
{
protected:
    const std::string kKey;

    std::unique_ptr<spdlog::formatter> pf_;

public:
    pattern_populator(const std::string &key, const std::string &pattern);

    pattern_populator(const pattern_populator &other);

    virtual void populate(const details::log_msg &msg, nlohmann::json &dest) override;

    virtual std::unique_ptr<populator> clone() const override;
}